

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.cpp
# Opt level: O0

void __thiscall TPZFront<float>::FreeGlobal(TPZFront<float> *this,int64_t global)

{
  long *plVar1;
  ostream *this_00;
  int64_t in_RSI;
  TPZStack<int,_10> *in_RDI;
  int64_t index;
  int in_stack_ffffffffffffffdc;
  
  plVar1 = TPZVec<long>::operator[]
                     ((TPZVec<long> *)(in_RDI[1].super_TPZManVector<int,_10>.fExtAlloc + 6),in_RSI);
  if (*plVar1 == -1) {
    this_00 = std::operator<<((ostream *)&std::cout,
                              "TPZFront FreeGlobal was called with wrong parameters !");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    plVar1 = TPZVec<long>::operator[]
                       ((TPZVec<long> *)(in_RDI[1].super_TPZManVector<int,_10>.fExtAlloc + 6),in_RSI
                       );
    plVar1 = TPZVec<long>::operator[]
                       ((TPZVec<long> *)
                        &(in_RDI->super_TPZManVector<int,_10>).super_TPZVec<int>.fNElements,*plVar1)
    ;
    *plVar1 = -1;
    plVar1 = TPZVec<long>::operator[]
                       ((TPZVec<long> *)(in_RDI[1].super_TPZManVector<int,_10>.fExtAlloc + 6),in_RSI
                       );
    *plVar1 = -1;
    TPZStack<int,_10>::Push(in_RDI,in_stack_ffffffffffffffdc);
  }
  return;
}

Assistant:

void TPZFront<TVar>::FreeGlobal(int64_t global)
{
	if(fLocal[global]==-1){
		cout << "TPZFront FreeGlobal was called with wrong parameters !" << endl;
		return;
	}
	int64_t index;
	index=fLocal[global];
	fGlobal[index]=-1;
	fLocal[global]=-1;
	fFree.Push(index);
}